

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  ~IfcStructuralConnection(this);
  operator_delete(this,0x148);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}